

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cx_string.hpp
# Opt level: O2

cx_string<31UL> * __thiscall
mserialize::cx_strcat<1ul,1ul,12ul,1ul,9ul,1ul,5ul,1ul>
          (cx_string<31UL> *__return_storage_ptr__,mserialize *this,cx_string<1UL> *strings,
          cx_string<1UL> *strings_1,cx_string<12UL> *strings_2,cx_string<1UL> *strings_3,
          cx_string<9UL> *strings_4,cx_string<1UL> *strings_5,cx_string<5UL> *strings_6,
          cx_string<1UL> *strings_7)

{
  char *pcVar1;
  long lVar2;
  ulong uVar3;
  ulong auStack_c8 [10];
  long lStack_78;
  mserialize *local_70;
  cx_string<1UL> *local_68;
  cx_string<1UL> *local_60;
  cx_string<12UL> *local_58;
  cx_string<1UL> *local_50;
  cx_string<9UL> *local_48;
  cx_string<1UL> *pcStack_40;
  cx_string<5UL> *local_38;
  char buffer [32];
  
  pcVar1 = buffer;
  buffer[0x10] = '\0';
  buffer[0x11] = '\0';
  buffer[0x12] = '\0';
  buffer[0x13] = '\0';
  buffer[0x14] = '\0';
  buffer[0x15] = '\0';
  buffer[0x16] = '\0';
  buffer[0x17] = '\0';
  buffer[0x18] = '\0';
  buffer[0x19] = '\0';
  buffer[0x1a] = '\0';
  buffer[0x1b] = '\0';
  buffer[0x1c] = '\0';
  buffer[0x1d] = '\0';
  buffer[0x1e] = '\0';
  buffer[0x1f] = '\0';
  buffer[0] = '\0';
  buffer[1] = '\0';
  buffer[2] = '\0';
  buffer[3] = '\0';
  buffer[4] = '\0';
  buffer[5] = '\0';
  buffer[6] = '\0';
  buffer[7] = '\0';
  buffer[8] = '\0';
  buffer[9] = '\0';
  buffer[10] = '\0';
  buffer[0xb] = '\0';
  buffer[0xc] = '\0';
  buffer[0xd] = '\0';
  buffer[0xe] = '\0';
  buffer[0xf] = '\0';
  local_70 = this;
  local_68 = strings;
  local_60 = strings_1;
  local_58 = strings_2;
  local_50 = strings_3;
  local_48 = strings_4;
  pcStack_40 = strings_5;
  local_38 = strings_6;
  auStack_c8[1] = 1;
  auStack_c8[2] = 1;
  auStack_c8[3] = 0xc;
  auStack_c8[4] = 1;
  auStack_c8[5] = 9;
  auStack_c8[6] = 1;
  auStack_c8[7] = 5;
  auStack_c8[8] = 1;
  for (lVar2 = 1; lVar2 != 9; lVar2 = lVar2 + 1) {
    for (uVar3 = 0; uVar3 < auStack_c8[lVar2]; uVar3 = uVar3 + 1) {
      pcVar1[uVar3] = *(char *)((&lStack_78)[lVar2] + uVar3);
    }
    pcVar1 = pcVar1 + uVar3;
  }
  cx_string<31UL>::cx_string(__return_storage_ptr__,buffer);
  return __return_storage_ptr__;
}

Assistant:

constexpr auto cx_strcat(const cx_string<N>&&... strings)
{
  char buffer[detail::sum<N...>()+1] = {0};
  const char* data[] = {"", strings.data()...};
  const std::size_t size[] = {0, strings.size()...};

  char* out = buffer;
  for (std::size_t i = 1; i <= sizeof...(N); ++i)
  {
    for (std::size_t s = 0; s < size[i]; ++s) { *out++ = data[i][s]; } // NOLINT
  }

  return cx_string<sizeof(buffer)-1>(buffer);
}